

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O1

int duckdb_hll::hllSparseSet(robj *o,long index,uint8_t count)

{
  void *pvVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  unsigned_long _fb8;
  sds pcVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  byte *pbVar9;
  byte bVar10;
  undefined7 in_register_00000011;
  byte *pbVar11;
  int iVar12;
  long lVar13;
  byte *pbVar14;
  byte *__src;
  long lVar15;
  byte bVar16;
  uint uVar17;
  byte *pbVar18;
  byte *pbVar19;
  byte *pbVar20;
  bool bVar21;
  uint8_t seq [5];
  byte local_45 [5];
  undefined8 local_40;
  robj *local_38;
  
  local_40 = CONCAT71(in_register_00000011,count);
  if (0x20 < count) goto LAB_01876d5c;
  pcVar5 = sdsMakeRoomFor((sds)o->ptr,3);
  o->ptr = pcVar5;
  switch(pcVar5[-1] & 7) {
  case 0:
    uVar8 = (ulong)((byte)pcVar5[-1] >> 3);
    break;
  case 1:
    uVar8 = (ulong)(byte)pcVar5[-4];
    break;
  case 2:
    uVar8 = (ulong)*(ushort *)(pcVar5 + -6);
    break;
  case 3:
    uVar8 = (ulong)*(uint *)(pcVar5 + -10);
    break;
  case 4:
    uVar8 = *(ulong *)(pcVar5 + -0x12);
    break;
  default:
    uVar8 = 0;
  }
  pbVar20 = (byte *)(pcVar5 + 0x11);
  pbVar19 = (byte *)(pcVar5 + uVar8);
  lVar15 = 0;
  pbVar11 = (byte *)0x0;
  pbVar14 = pbVar20;
  lVar7 = 0;
  if (0x11 < (long)uVar8) {
    pbVar11 = (byte *)0x0;
    lVar7 = 0;
    do {
      pbVar9 = pbVar14;
      bVar16 = *pbVar9;
      uVar8 = (ulong)bVar16;
      lVar13 = 1;
      if (0x3f < bVar16) {
        if ((char)bVar16 < '\0') {
          uVar8 = (ulong)(bVar16 & 3);
        }
        else {
          uVar8 = (ulong)((bVar16 & 0x3f) << 8 | (uint)pbVar9[1]);
          lVar13 = 2;
        }
      }
      lVar6 = lVar7 + uVar8 + 1;
      if (index < lVar6) {
        lVar13 = 0;
      }
      lVar15 = uVar8 + 1;
      pbVar14 = pbVar9 + lVar13;
    } while ((lVar6 <= index) && (pbVar11 = pbVar9, lVar7 = lVar6, pbVar14 < pbVar19));
  }
  if (lVar15 == 0) {
    return -1;
  }
  bVar16 = *pbVar14;
  uVar17 = (uint)bVar16;
  pbVar9 = pbVar14 + 2;
  if ((uVar17 & 0xc0) != 0x40) {
    pbVar9 = pbVar14 + 1;
  }
  bVar10 = 0;
  __src = (byte *)0x0;
  if (pbVar9 < pbVar19) {
    __src = pbVar9;
  }
  if ((bVar16 & 0xc0) == 0) {
    bVar21 = true;
  }
  else if ((bVar16 & 0xc0) == 0x40) {
    uVar17 = (uint)pbVar14[1] | (uVar17 & 0x3f) << 8;
    bVar21 = true;
    bVar10 = 1;
  }
  else {
    uVar17 = uVar17 & 3;
    bVar21 = false;
    bVar10 = 0;
  }
  local_38 = o;
  if (bVar21) {
LAB_01876f68:
    if (uVar17 != 0 || (bVar16 & 0xc0) != 0) {
      iVar4 = (int)lVar15 + (int)lVar7 + -1;
      if (((bVar16 & 0xc0) != 0 & (bVar10 ^ 1)) == 0) {
        lVar7 = index - lVar7;
        if (lVar7 == 0) {
          pbVar18 = local_45;
        }
        else if ((int)lVar7 < 0x41) {
          local_45[0] = (char)lVar7 - 1;
          pbVar18 = local_45 + 1;
        }
        else {
          iVar12 = (int)lVar7 + -1;
          local_45[0] = (byte)((uint)iVar12 >> 8) | 0x40;
          pbVar18 = local_45 + 2;
          local_45[1] = (byte)iVar12;
        }
        *pbVar18 = (byte)local_40 * '\x04' + 0x7c | 0x80;
        if (iVar4 == index) {
LAB_01877055:
          iVar4 = (int)pbVar18 + 1;
        }
        else {
          iVar4 = iVar4 - (int)index;
          if (iVar4 < 0x41) {
            bVar16 = (char)iVar4 - 1;
            goto LAB_0187707f;
          }
          pbVar18[1] = (byte)((uint)(iVar4 + -1) >> 8) | 0x40;
          pbVar18[2] = (byte)(iVar4 + -1);
          iVar4 = (int)pbVar18 + 3;
        }
      }
      else {
        bVar16 = bVar16 >> 2 & 0x1f;
        if (index == lVar7) {
          pbVar18 = local_45;
        }
        else {
          local_45[0] = ((byte)index - (char)lVar7) - 1 | bVar16 * '\x04' | 0x80;
          pbVar18 = local_45 + 1;
        }
        *pbVar18 = (byte)local_40 * '\x04' + 0x7c | 0x80;
        if (iVar4 == index) goto LAB_01877055;
        bVar16 = (char)iVar4 + ~(byte)index | bVar16 << 2 | 0x80;
LAB_0187707f:
        pbVar18[1] = bVar16;
        iVar4 = (int)pbVar18 + 2;
      }
      iVar4 = iVar4 - (int)local_45;
      uVar17 = ~(uint)bVar10 + iVar4;
      if (0 < (int)uVar17) {
        switch(pcVar5[-1] & 7) {
        case 0:
          uVar8 = (ulong)((byte)pcVar5[-1] >> 3);
          break;
        case 1:
          uVar8 = (ulong)(byte)pcVar5[-4];
          break;
        case 2:
          uVar8 = (ulong)*(ushort *)(pcVar5 + -6);
          break;
        case 3:
          uVar8 = (ulong)*(uint *)(pcVar5 + -10);
          break;
        case 4:
          uVar8 = *(ulong *)(pcVar5 + -0x12);
          break;
        default:
          uVar8 = 0;
        }
        if (3000 < uVar17 + uVar8) {
LAB_01876d5c:
          iVar4 = hllSparseToDense(o);
          if (iVar4 == -1) {
            return -1;
          }
          pvVar1 = o->ptr;
          lVar7 = index * 6;
          lVar15 = index * 6 + 7;
          if (-1 < lVar7) {
            lVar15 = lVar7;
          }
          lVar15 = lVar15 >> 3;
          bVar3 = (byte)lVar7 & 6;
          bVar2 = 8 - bVar3;
          bVar16 = *(byte *)((long)pvVar1 + lVar15 + 0x11);
          bVar10 = *(byte *)((long)pvVar1 + lVar15 + 0x12);
          if ((uint)(byte)local_40 <=
              (((uint)(bVar16 >> bVar3) | (uint)bVar10 << (bVar2 & 0x1f)) & 0x3f)) {
            return 0;
          }
          *(byte *)((long)pvVar1 + lVar15 + 0x11) =
               (byte)local_40 << bVar3 | ~('?' << bVar3) & bVar16;
          *(byte *)((long)pvVar1 + lVar15 + 0x12) =
               (byte)local_40 >> (bVar2 & 0x3f) | (byte)(-0x40 >> (bVar2 & 0x1f)) & bVar10;
          return 1;
        }
      }
      lVar7 = (long)(int)uVar17;
      if ((uVar17 != 0) && (pbVar9 < pbVar19)) {
        memmove(__src + lVar7,__src,(long)pbVar19 - (long)__src);
      }
      sdsIncrLen((sds)local_38->ptr,lVar7);
      switchD_012dd528::default(pbVar14,local_45,(long)iVar4);
      pbVar19 = pbVar19 + lVar7;
      goto LAB_01877137;
    }
  }
  else {
    if ((byte)local_40 <= (byte)((bVar16 >> 2 & 0x1f) + 1)) {
      return 0;
    }
    if (uVar17 != 0) goto LAB_01876f68;
  }
  *pbVar14 = (byte)local_40 * '\x04' + 0x7c | 0x80;
LAB_01877137:
  if (pbVar11 != (byte *)0x0) {
    pbVar20 = pbVar11;
  }
  iVar4 = 5;
  do {
    pbVar14 = pbVar20 + 1;
    iVar12 = 1 - iVar4;
    while( true ) {
      iVar4 = iVar12;
      if ((pbVar19 <= pbVar20) || (iVar12 = iVar4 + 1, iVar12 == 2)) {
        pbVar20 = (byte *)((long)local_38->ptr + 0xf);
        *pbVar20 = *pbVar20 | 0x80;
        return 1;
      }
      bVar16 = *pbVar20;
      if ((bVar16 & 0xc0) == 0) goto LAB_018771ed;
      if ((bVar16 & 0xc0) == 0x40) break;
      if ((pbVar19 <= pbVar14) || (bVar10 = *pbVar14, -1 < (char)bVar10)) goto LAB_018771ed;
      bVar21 = true;
      if (((bVar10 ^ bVar16) & 0x7c) == 0) {
        bVar10 = (bVar10 & 3) + (bVar16 & 3);
        bVar21 = 2 < bVar10;
        if (!bVar21) {
          pbVar20[1] = bVar10 + 1 | bVar16 & 0x7c | 0x80;
          memmove(pbVar20,pbVar14,(long)pbVar19 - (long)pbVar20);
          sdsIncrLen((sds)local_38->ptr,-1);
          pbVar19 = pbVar19 + -1;
        }
      }
      if (bVar21) goto LAB_018771ed;
    }
    pbVar14 = pbVar20 + 2;
LAB_018771ed:
    iVar4 = -iVar4;
    pbVar20 = pbVar14;
  } while( true );
}

Assistant:

int hllSparseSet(robj *o, long index, uint8_t count) {
    struct hllhdr *hdr;
    uint8_t oldcount, *sparse, *end, *p, *prev, *next;
    long first, span;
    long is_zero = 0, is_xzero = 0, is_val = 0, runlen = 0;
    uint8_t seq[5], *n;
    int last;
    int len;
    int seqlen;
    int oldlen;
    int deltalen;

    /* If the count is too big to be representable by the sparse representation
     * switch to dense representation. */
    if (count > HLL_SPARSE_VAL_MAX_VALUE) goto promote;

    /* When updating a sparse representation, sometimes we may need to
     * enlarge the buffer for up to 3 bytes in the worst case (XZERO split
     * into XZERO-VAL-XZERO). Make sure there is enough space right now
     * so that the pointers we take during the execution of the function
     * will be valid all the time. */
    o->ptr = (sds) sdsMakeRoomFor((sds) o->ptr,3);

    /* Step 1: we need to locate the opcode we need to modify to check
     * if a value update is actually needed. */
    sparse = p = ((uint8_t*)o->ptr) + HLL_HDR_SIZE;
    end = p + sdslen((sds) o->ptr) - HLL_HDR_SIZE;

    first = 0;
    prev = NULL; /* Points to previous opcode at the end of the loop. */
    next = NULL; /* Points to the next opcode at the end of the loop. */
    span = 0;
    while(p < end) {
        long oplen;

        /* Set span to the number of registers covered by this opcode.
         *
         * This is the most performance critical loop of the sparse
         * representation. Sorting the conditionals from the most to the
         * least frequent opcode in many-bytes sparse HLLs is faster. */
        oplen = 1;
        if (HLL_SPARSE_IS_ZERO(p)) {
            span = HLL_SPARSE_ZERO_LEN(p);
        } else if (HLL_SPARSE_IS_VAL(p)) {
            span = HLL_SPARSE_VAL_LEN(p);
        } else { /* XZERO. */
            span = HLL_SPARSE_XZERO_LEN(p);
            oplen = 2;
        }
        /* Break if this opcode covers the register as 'index'. */
        if (index <= first+span-1) break;
        prev = p;
        p += oplen;
        first += span;
    }
    if (span == 0) return -1; /* Invalid format. */

    next = HLL_SPARSE_IS_XZERO(p) ? p+2 : p+1;
    if (next >= end) next = NULL;

    /* Cache current opcode type to avoid using the macro again and
     * again for something that will not change.
     * Also cache the run-length of the opcode. */
    if (HLL_SPARSE_IS_ZERO(p)) {
        is_zero = 1;
        runlen = HLL_SPARSE_ZERO_LEN(p);
    } else if (HLL_SPARSE_IS_XZERO(p)) {
        is_xzero = 1;
        runlen = HLL_SPARSE_XZERO_LEN(p);
    } else {
        is_val = 1;
        runlen = HLL_SPARSE_VAL_LEN(p);
    }

    /* Step 2: After the loop:
     *
     * 'first' stores to the index of the first register covered
     *  by the current opcode, which is pointed by 'p'.
     *
     * 'next' ad 'prev' store respectively the next and previous opcode,
     *  or NULL if the opcode at 'p' is respectively the last or first.
     *
     * 'span' is set to the number of registers covered by the current
     *  opcode.
     *
     * There are different cases in order to update the data structure
     * in place without generating it from scratch:
     *
     * A) If it is a VAL opcode already set to a value >= our 'count'
     *    no update is needed, regardless of the VAL run-length field.
     *    In this case PFADD returns 0 since no changes are performed.
     *
     * B) If it is a VAL opcode with len = 1 (representing only our
     *    register) and the value is less than 'count', we just update it
     *    since this is a trivial case. */
    if (is_val) {
        oldcount = HLL_SPARSE_VAL_VALUE(p);
        /* Case A. */
        if (oldcount >= count) return 0;

        /* Case B. */
        if (runlen == 1) {
            HLL_SPARSE_VAL_SET(p,count,1);
            goto updated;
        }
    }

    /* C) Another trivial to handle case is a ZERO opcode with a len of 1.
     * We can just replace it with a VAL opcode with our value and len of 1. */
    if (is_zero && runlen == 1) {
        HLL_SPARSE_VAL_SET(p,count,1);
        goto updated;
    }

    /* D) General case.
     *
     * The other cases are more complex: our register requires to be updated
     * and is either currently represented by a VAL opcode with len > 1,
     * by a ZERO opcode with len > 1, or by an XZERO opcode.
     *
     * In those cases the original opcode must be split into multiple
     * opcodes. The worst case is an XZERO split in the middle resuling into
     * XZERO - VAL - XZERO, so the resulting sequence max length is
     * 5 bytes.
     *
     * We perform the split writing the new sequence into the 'new' buffer
     * with 'newlen' as length. Later the new sequence is inserted in place
     * of the old one, possibly moving what is on the right a few bytes
     * if the new sequence is longer than the older one. */
    n = seq;
    last = first+span-1; /* Last register covered by the sequence. */

    if (is_zero || is_xzero) {
        /* Handle splitting of ZERO / XZERO. */
        if (index != first) {
            len = index-first;
            if (len > HLL_SPARSE_ZERO_MAX_LEN) {
                HLL_SPARSE_XZERO_SET(n,len);
                n += 2;
            } else {
                HLL_SPARSE_ZERO_SET(n,len);
                n++;
            }
        }
        HLL_SPARSE_VAL_SET(n,count,1);
        n++;
        if (index != last) {
            len = last-index;
            if (len > HLL_SPARSE_ZERO_MAX_LEN) {
                HLL_SPARSE_XZERO_SET(n,len);
                n += 2;
            } else {
                HLL_SPARSE_ZERO_SET(n,len);
                n++;
            }
        }
    } else {
        /* Handle splitting of VAL. */
        int curval = HLL_SPARSE_VAL_VALUE(p);

        if (index != first) {
            len = index-first;
            HLL_SPARSE_VAL_SET(n,curval,len);
            n++;
        }
        HLL_SPARSE_VAL_SET(n,count,1);
        n++;
        if (index != last) {
            len = last-index;
            HLL_SPARSE_VAL_SET(n,curval,len);
            n++;
        }
    }

    /* Step 3: substitute the new sequence with the old one.
     *
     * Note that we already allocated space on the sds string
     * calling sdsMakeRoomFor(). */
     seqlen = n-seq;
     oldlen = is_xzero ? 2 : 1;
     deltalen = seqlen-oldlen;

     if (deltalen > 0 &&
         sdslen((sds) o->ptr)+deltalen > HLL_SPARSE_MAX_BYTES) goto promote;
     if (deltalen && next) memmove(next+deltalen,next,end-next);
     sdsIncrLen((sds) o->ptr,deltalen);
     memcpy(p,seq,seqlen);
     end += deltalen;

updated: {
    /* Step 4: Merge adjacent values if possible.
     *
     * The representation was updated, however the resulting representation
     * may not be optimal: adjacent VAL opcodes can sometimes be merged into
     * a single one. */
    p = prev ? prev : sparse;
    int scanlen = 5; /* Scan up to 5 upcodes starting from prev. */
    while (p < end && scanlen--) {
        if (HLL_SPARSE_IS_XZERO(p)) {
            p += 2;
            continue;
        } else if (HLL_SPARSE_IS_ZERO(p)) {
            p++;
            continue;
        }
        /* We need two adjacent VAL opcodes to try a merge, having
         * the same value, and a len that fits the VAL opcode max len. */
        if (p+1 < end && HLL_SPARSE_IS_VAL(p+1)) {
            int v1 = HLL_SPARSE_VAL_VALUE(p);
            int v2 = HLL_SPARSE_VAL_VALUE(p+1);
            if (v1 == v2) {
                int len = HLL_SPARSE_VAL_LEN(p)+HLL_SPARSE_VAL_LEN(p+1);
                if (len <= HLL_SPARSE_VAL_MAX_LEN) {
                    HLL_SPARSE_VAL_SET(p+1,v1,len);
                    memmove(p,p+1,end-p);
                    sdsIncrLen((sds) o->ptr,-1);
                    end--;
                    /* After a merge we reiterate without incrementing 'p'
                     * in order to try to merge the just merged value with
                     * a value on its right. */
                    continue;
                }
            }
        }
        p++;
    }

    /* Invalidate the cached cardinality. */
    hdr = (struct hllhdr *) o->ptr;
    HLL_INVALIDATE_CACHE(hdr);
    return 1;
}
promote: /* Promote to dense representation. */
    if (hllSparseToDense(o) == HLL_C_ERR) return -1; /* Corrupted HLL. */
    hdr = (struct hllhdr *) o->ptr;

    /* We need to call hllDenseAdd() to perform the operation after the
     * conversion. However the result must be 1, since if we need to
     * convert from sparse to dense a register requires to be updated.
     *
     * Note that this in turn means that PFADD will make sure the command
     * is propagated to slaves / AOF, so if there is a sparse -> dense
     * conversion, it will be performed in all the slaves as well. */
    int dense_retval = hllDenseSet(hdr->registers + 1,index,count);
    assert(dense_retval == 1);
    return dense_retval;
}